

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void handle_C_option(char *z)

{
  int iVar1;
  Boolean BVar2;
  size_t sVar3;
  int len;
  char *z_local;
  
  sVar3 = strlen(z);
  iVar1 = (int)sVar3;
  output_dir = (char *)malloc((long)(iVar1 + 2));
  if (output_dir == (char *)0x0) {
    memory_error();
  }
  strcpy(output_dir,z);
  BVar2 = is_seperator((int)output_dir[iVar1 + -1]);
  if (BVar2 == LEMON_FALSE) {
    output_dir[iVar1] = '/';
    output_dir[iVar1 + 1] = '\0';
  }
  return;
}

Assistant:

static void handle_C_option(char *z){
  int len = lemonStrlen(z);
  output_dir = (char *) malloc( len+2 );
  if( output_dir==0 ){
    memory_error();
  }
  strcpy(output_dir, z);
  if( !is_seperator(output_dir[len-1]) ){
    output_dir[len] = '/';
    output_dir[len+1] = '\0';
  }
}